

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O2

int x509_crt_check_signature(mbedtls_x509_crt *child,mbedtls_x509_crt *parent)

{
  mbedtls_md_type_t md_alg;
  mbedtls_pk_type_t type;
  void *options;
  byte bVar1;
  int iVar2;
  mbedtls_md_info_t *md_info;
  uchar hash [64];
  
  md_info = mbedtls_md_info_from_type(child->sig_md);
  iVar2 = mbedtls_md(md_info,(child->tbs).p,(child->tbs).len,hash);
  if (iVar2 == 0) {
    md_alg = child->sig_md;
    type = child->sig_pk;
    options = child->sig_opts;
    bVar1 = mbedtls_md_get_size(md_info);
    iVar2 = mbedtls_pk_verify_ext
                      (type,options,&parent->pk,md_alg,hash,(ulong)bVar1,(child->sig).p,
                       (child->sig).len);
    iVar2 = -(uint)(iVar2 != 0);
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int x509_crt_check_signature( const mbedtls_x509_crt *child,
                                     mbedtls_x509_crt *parent )
{
    const mbedtls_md_info_t *md_info;
    unsigned char hash[MBEDTLS_MD_MAX_SIZE];

    md_info = mbedtls_md_info_from_type( child->sig_md );
    if( mbedtls_md( md_info, child->tbs.p, child->tbs.len, hash ) != 0 )
    {
        /* Note: this can't happen except after an internal error */
        return( -1 );
    }

    if( mbedtls_pk_verify_ext( child->sig_pk, child->sig_opts, &parent->pk,
                child->sig_md, hash, mbedtls_md_get_size( md_info ),
                child->sig.p, child->sig.len ) != 0 )
    {
        return( -1 );
    }

    return( 0 );
}